

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.h
# Opt level: O2

TestAllTypesLite_NestedMessage * __thiscall
proto2_unittest::TestAllTypesLite::_internal_mutable_optional_nested_message(TestAllTypesLite *this)

{
  TestAllTypesLite_NestedMessage *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.optional_nested_message_;
  if (pTVar1 != (TestAllTypesLite_NestedMessage *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestAllTypesLite_NestedMessage *)
           google::protobuf::Arena::
           DefaultConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena);
  (this->field_0)._impl_.optional_nested_message_ = pTVar1;
  return pTVar1;
}

Assistant:

TestAllTypesLite::_internal_mutable_optional_nested_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_nested_message_ == nullptr) {
    auto* p = ::google::protobuf::MessageLite::DefaultConstruct<::proto2_unittest::TestAllTypesLite_NestedMessage>(GetArena());
    _impl_.optional_nested_message_ = reinterpret_cast<::proto2_unittest::TestAllTypesLite_NestedMessage*>(p);
  }
  return _impl_.optional_nested_message_;
}